

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O2

void __thiscall
ConfidentialValue_GetCommitment_Test::TestBody(ConfidentialValue_GetCommitment_Test *this)

{
  char *message;
  AssertHelper local_c0;
  AssertionResult gtest_ar;
  ConfidentialValue commitment;
  string local_80;
  BlindFactor vbf;
  Amount amount;
  ConfidentialAssetId asset_commitment;
  
  std::__cxx11::string::string
            ((string *)&commitment,
             "0a533b742a568c0b5285bf5bdfe9623a78082d19fac9be1678f7c3adbb48b34d29",(allocator *)&vbf)
  ;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&asset_commitment,(string *)&commitment);
  std::__cxx11::string::~string((string *)&commitment);
  std::__cxx11::string::string
            ((string *)&commitment,
             "fe3357df1f35df75412d9ad86ebd99e622e26019722f316027787a685e2cd71a",
             (allocator *)&local_80);
  cfd::core::BlindFactor::BlindFactor(&vbf,(string *)&commitment);
  std::__cxx11::string::~string((string *)&commitment);
  cfd::core::Amount::Amount(&amount,13000000000000);
  cfd::core::ConfidentialValue::GetCommitment(&commitment,&amount,&asset_commitment,&vbf);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_80,&commitment);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"commitment.GetHex().c_str()",
             "\"08672d4e2e60f2e8d742552a8bc4ca6335ed214982c7728b4483284169aaae7f49\"",
             local_80._M_dataplus._M_p,
             "08672d4e2e60f2e8d742552a8bc4ca6335ed214982c7728b4483284169aaae7f49");
  std::__cxx11::string::~string((string *)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0xaa,message);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ConfidentialValue::~ConfidentialValue(&commitment);
  cfd::core::BlindFactor::~BlindFactor(&vbf);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&asset_commitment);
  return;
}

Assistant:

TEST(ConfidentialValue, GetCommitment) {
  ConfidentialAssetId asset_commitment(
      "0a533b742a568c0b5285bf5bdfe9623a78082d19fac9be1678f7c3adbb48b34d29");
  BlindFactor vbf(
      "fe3357df1f35df75412d9ad86ebd99e622e26019722f316027787a685e2cd71a");
  Amount amount(int64_t{13000000000000});
  ConfidentialValue commitment = ConfidentialValue::GetCommitment(
      amount, asset_commitment, vbf);
  EXPECT_STREQ(
      commitment.GetHex().c_str(),
      "08672d4e2e60f2e8d742552a8bc4ca6335ed214982c7728b4483284169aaae7f49");
}